

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O3

void Aig_ManStop(Aig_Man_t *p)

{
  void *pvVar1;
  Vec_Vec_t *pVVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  Aig_Man_t *pAVar6;
  Vec_Int_t *pVVar7;
  Vec_Ptr_t *pVVar8;
  
  pAVar6 = p;
  if (p->time1 != 0) {
    Abc_Print((int)p,"%s =","time1");
    Abc_Print((int)pAVar6,"%9.2f sec\n",(double)p->time1 / 1000000.0);
  }
  iVar5 = (int)pAVar6;
  if (p->time2 != 0) {
    Abc_Print(iVar5,"%s =","time2");
    Abc_Print(iVar5,"%9.2f sec\n",(double)p->time2 / 1000000.0);
  }
  lVar3 = (long)p->vObjs->nSize;
  if (0 < lVar3) {
    lVar4 = 0;
    do {
      pvVar1 = p->vObjs->pArray[lVar4];
      if ((pvVar1 != (void *)0x0) && ((*(byte *)((long)pvVar1 + 0x18) & 0x30) != 0)) {
        __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMan.c"
                      ,0xc3,"void Aig_ManStop(Aig_Man_t *)");
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  Tim_ManStopP((Tim_Man_t **)&p->pManTime);
  if (p->pFanData != (int *)0x0) {
    Aig_ManFanoutStop(p);
  }
  if (p->pManExdc != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pManExdc);
  }
  Aig_MmFixedStop(p->pMemObjs,0);
  pVVar8 = p->vCis;
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
      p->vCis->pArray = (void **)0x0;
      pVVar8 = p->vCis;
      if (pVVar8 == (Vec_Ptr_t *)0x0) goto LAB_00604aea;
    }
    free(pVVar8);
    p->vCis = (Vec_Ptr_t *)0x0;
  }
LAB_00604aea:
  pVVar8 = p->vCos;
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
      p->vCos->pArray = (void **)0x0;
      pVVar8 = p->vCos;
      if (pVVar8 == (Vec_Ptr_t *)0x0) goto LAB_00604b26;
    }
    free(pVVar8);
    p->vCos = (Vec_Ptr_t *)0x0;
  }
LAB_00604b26:
  pVVar8 = p->vObjs;
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
      p->vObjs->pArray = (void **)0x0;
      pVVar8 = p->vObjs;
      if (pVVar8 == (Vec_Ptr_t *)0x0) goto LAB_00604b62;
    }
    free(pVVar8);
    p->vObjs = (Vec_Ptr_t *)0x0;
  }
LAB_00604b62:
  pVVar8 = p->vBufs;
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
      p->vBufs->pArray = (void **)0x0;
      pVVar8 = p->vBufs;
      if (pVVar8 == (Vec_Ptr_t *)0x0) goto LAB_00604b9e;
    }
    free(pVVar8);
    p->vBufs = (Vec_Ptr_t *)0x0;
  }
LAB_00604b9e:
  pVVar8 = p->unfold2_type_I;
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
      p->unfold2_type_I->pArray = (void **)0x0;
      pVVar8 = p->unfold2_type_I;
      if (pVVar8 == (Vec_Ptr_t *)0x0) goto LAB_00604be6;
    }
    free(pVVar8);
    p->unfold2_type_I = (Vec_Ptr_t *)0x0;
  }
LAB_00604be6:
  pVVar8 = p->unfold2_type_II;
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
      p->unfold2_type_II->pArray = (void **)0x0;
      pVVar8 = p->unfold2_type_II;
      if (pVVar8 == (Vec_Ptr_t *)0x0) goto LAB_00604c2e;
    }
    free(pVVar8);
    p->unfold2_type_II = (Vec_Ptr_t *)0x0;
  }
LAB_00604c2e:
  pVVar7 = p->vLevelR;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vLevelR->pArray = (int *)0x0;
      pVVar7 = p->vLevelR;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00604c76;
    }
    free(pVVar7);
    p->vLevelR = (Vec_Int_t *)0x0;
  }
LAB_00604c76:
  pVVar2 = p->vLevels;
  if (pVVar2 != (Vec_Vec_t *)0x0) {
    iVar5 = pVVar2->nSize;
    if (0 < iVar5) {
      lVar3 = 0;
      do {
        pvVar1 = pVVar2->pArray[lVar3];
        if (pvVar1 != (void *)0x0) {
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
          }
          free(pvVar1);
          iVar5 = pVVar2->nSize;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar5);
    }
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
    }
    free(pVVar2);
    p->vLevels = (Vec_Vec_t *)0x0;
  }
  pVVar7 = p->vFlopNums;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vFlopNums->pArray = (int *)0x0;
      pVVar7 = p->vFlopNums;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00604d28;
    }
    free(pVVar7);
    p->vFlopNums = (Vec_Int_t *)0x0;
  }
LAB_00604d28:
  pVVar7 = p->vFlopReprs;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vFlopReprs->pArray = (int *)0x0;
      pVVar7 = p->vFlopReprs;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00604d70;
    }
    free(pVVar7);
    p->vFlopReprs = (Vec_Int_t *)0x0;
  }
LAB_00604d70:
  pVVar8 = p->vOnehots;
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    iVar5 = pVVar8->nSize;
    if (0 < iVar5) {
      lVar3 = 0;
      do {
        pvVar1 = pVVar8->pArray[lVar3];
        if (pvVar1 != (void *)0x0) {
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
          }
          free(pvVar1);
          iVar5 = pVVar8->nSize;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar5);
    }
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
    }
    free(pVVar8);
    p->vOnehots = (Vec_Ptr_t *)0x0;
  }
  pVVar2 = p->vClockDoms;
  if (pVVar2 != (Vec_Vec_t *)0x0) {
    iVar5 = pVVar2->nSize;
    if (0 < iVar5) {
      lVar3 = 0;
      do {
        pvVar1 = pVVar2->pArray[lVar3];
        if (pvVar1 != (void *)0x0) {
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
          }
          free(pvVar1);
          iVar5 = pVVar2->nSize;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar5);
    }
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
    }
    free(pVVar2);
    p->vClockDoms = (Vec_Vec_t *)0x0;
  }
  pVVar7 = p->vProbs;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vProbs->pArray = (int *)0x0;
      pVVar7 = p->vProbs;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00604e8c;
    }
    free(pVVar7);
    p->vProbs = (Vec_Int_t *)0x0;
  }
LAB_00604e8c:
  pVVar7 = p->vCiNumsOrig;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vCiNumsOrig->pArray = (int *)0x0;
      pVVar7 = p->vCiNumsOrig;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00604ed4;
    }
    free(pVVar7);
    p->vCiNumsOrig = (Vec_Int_t *)0x0;
  }
LAB_00604ed4:
  pVVar8 = p->vMapped;
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
      p->vMapped->pArray = (void **)0x0;
      pVVar8 = p->vMapped;
      if (pVVar8 == (Vec_Ptr_t *)0x0) goto LAB_00604f1c;
    }
    free(pVVar8);
    p->vMapped = (Vec_Ptr_t *)0x0;
  }
LAB_00604f1c:
  pVVar8 = p->vSeqModelVec;
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    iVar5 = pVVar8->nSize;
    if (0 < iVar5) {
      lVar3 = 0;
      do {
        if ((void *)0x2 < pVVar8->pArray[lVar3]) {
          free(pVVar8->pArray[lVar3]);
          iVar5 = pVVar8->nSize;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar5);
    }
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
    }
    free(pVVar8);
  }
  if (p->pTerSimData != (uint *)0x0) {
    free(p->pTerSimData);
    p->pTerSimData = (uint *)0x0;
  }
  if (p->pFastSim != (int *)0x0) {
    free(p->pFastSim);
    p->pFastSim = (int *)0x0;
  }
  if (p->pData != (void *)0x0) {
    free(p->pData);
    p->pData = (void *)0x0;
  }
  if (p->pSeqModel != (Abc_Cex_t *)0x0) {
    free(p->pSeqModel);
    p->pSeqModel = (Abc_Cex_t *)0x0;
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pSpec != (char *)0x0) {
    free(p->pSpec);
    p->pSpec = (char *)0x0;
  }
  if (p->pObjCopies != (Aig_Obj_t **)0x0) {
    free(p->pObjCopies);
    p->pObjCopies = (Aig_Obj_t **)0x0;
  }
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    free(p->pReprs);
    p->pReprs = (Aig_Obj_t **)0x0;
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    free(p->pEquivs);
    p->pEquivs = (Aig_Obj_t **)0x0;
  }
  if (p->pTable != (Aig_Obj_t **)0x0) {
    free(p->pTable);
  }
  free(p);
  return;
}

Assistant:

void Aig_ManStop( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    if ( p->time1 ) { ABC_PRT( "time1", p->time1 ); }
    if ( p->time2 ) { ABC_PRT( "time2", p->time2 ); }
    // make sure the nodes have clean marks
    Aig_ManForEachObj( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    Tim_ManStopP( (Tim_Man_t **)&p->pManTime );
    if ( p->pFanData ) 
        Aig_ManFanoutStop( p );
    if ( p->pManExdc )  
        Aig_ManStop( p->pManExdc );
//    Aig_TableProfile( p );
    Aig_MmFixedStop( p->pMemObjs, 0 );
    Vec_PtrFreeP( &p->vCis );
    Vec_PtrFreeP( &p->vCos );
    Vec_PtrFreeP( &p->vObjs );
    Vec_PtrFreeP( &p->vBufs );
    //--jlong -- begin
    Vec_PtrFreeP( &p->unfold2_type_I );
    Vec_PtrFreeP( &p->unfold2_type_II );
    //--jlong -- end
    Vec_IntFreeP( &p->vLevelR );
    Vec_VecFreeP( &p->vLevels );
    Vec_IntFreeP( &p->vFlopNums );
    Vec_IntFreeP( &p->vFlopReprs );
    Vec_VecFreeP( (Vec_Vec_t **)&p->vOnehots );
    Vec_VecFreeP( &p->vClockDoms );
    Vec_IntFreeP( &p->vProbs );
    Vec_IntFreeP( &p->vCiNumsOrig );
    Vec_PtrFreeP( &p->vMapped );
    if ( p->vSeqModelVec )
        Vec_PtrFreeFree( p->vSeqModelVec );
    ABC_FREE( p->pTerSimData );
    ABC_FREE( p->pFastSim );
    ABC_FREE( p->pData );
    ABC_FREE( p->pSeqModel );
    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p->pObjCopies );
    ABC_FREE( p->pReprs );
    ABC_FREE( p->pEquivs );
    ABC_FREE( p->pTable );
    ABC_FREE( p );
}